

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void prepare_fpmt_workers
               (AV1_PRIMARY *ppi,AV1_COMP_DATA *first_cpi_data,AVxWorkerHook hook,
               int parallel_frame_count)

{
  AV1CdefWorkerData **cdef_worker;
  LRWorkerData *pLVar1;
  uint8_t uVar2;
  int iVar3;
  AV1_COMP *pAVar4;
  aom_internal_error_info *src;
  AV1CdefWorkerData *pAVar5;
  LRWorkerData *pLVar6;
  RestorationLineBuffers *pRVar7;
  int j;
  int iVar8;
  int iVar9;
  long lVar10;
  AV1_COMP_DATA *pAVar11;
  int num_fpmt_workers_prepared;
  AVxWorker *pAVar12;
  int i;
  int frame_idx;
  int local_64;
  int local_60;
  
  iVar3 = (ppi->p_mt_info).num_workers;
  local_60 = 0;
  local_64 = 0;
  cdef_worker = &(ppi->p_mt_info).cdef_worker;
  while (local_64 < iVar3) {
    pAVar12 = (ppi->p_mt_info).workers + local_64;
    (ppi->p_mt_info).p_workers[local_60] = pAVar12;
    pAVar4 = ppi->parallel_cpi[local_60];
    src = (pAVar4->common).error;
    iVar8 = _setjmp((__jmp_buf_tag *)src->jmp);
    if (iVar8 != 0) {
      src->setjmp = 0;
      restore_workers_after_fpmt(ppi,local_64,num_fpmt_workers_prepared);
      aom_internal_error_copy(&ppi->error,src);
    }
    src->setjmp = 1;
    (pAVar4->mt_info).workers = (ppi->p_mt_info).workers + local_64;
    (pAVar4->mt_info).tile_thr_data = (ppi->p_mt_info).tile_thr_data + local_64;
    iVar8 = (iVar3 - local_64) / ((int)hook - local_60);
    (pAVar4->mt_info).num_workers = iVar8;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 1) {
      iVar9 = (ppi->p_mt_info).num_mod_workers[lVar10];
      if (iVar8 < iVar9) {
        iVar9 = iVar8;
      }
      (pAVar4->mt_info).num_mod_workers[lVar10] = iVar9;
    }
    pAVar5 = *cdef_worker;
    if (pAVar5 != (AV1CdefWorkerData *)0x0) {
      (pAVar4->mt_info).cdef_worker = pAVar5 + local_64;
      (pAVar4->mt_info).restore_state_buf.cdef_srcbuf = pAVar5[local_64].srcbuf;
      uVar2 = ((pAVar4->common).seq_params)->monochrome;
      for (lVar10 = 0; (ulong)(uVar2 == '\0') * 2 + 1 != lVar10; lVar10 = lVar10 + 1) {
        (pAVar4->mt_info).restore_state_buf.cdef_colbuf[lVar10] = pAVar5[local_64].colbuf[lVar10];
      }
    }
    iVar9 = is_restoration_used(&pAVar4->common);
    if (iVar9 != 0) {
      iVar9 = local_64 + iVar8 + -1;
      pLVar6 = (pAVar4->mt_info).lr_row_sync.lrworkerdata;
      pLVar1 = pLVar6 + iVar9;
      pRVar7 = (RestorationLineBuffers *)pLVar1->rlbs;
      (pAVar4->mt_info).restore_state_buf.rst_tmpbuf = pLVar1->rst_tmpbuf;
      (pAVar4->mt_info).restore_state_buf.rlbs = pRVar7;
      pRVar7 = (pAVar4->common).rlbs;
      pLVar6 = pLVar6 + iVar9;
      pLVar6->rst_tmpbuf = (pAVar4->common).rst_tmpbuf;
      pLVar6->rlbs = pRVar7;
    }
    local_64 = local_64 + iVar8;
    av1_alloc_cdef_buffers
              (&pAVar4->common,cdef_worker,&(pAVar4->mt_info).cdef_sync,(ppi->p_mt_info).num_workers
               ,0);
    pAVar12->hook = get_compressed_data_hook;
    pAVar12->data1 = pAVar4;
    pAVar11 = first_cpi_data;
    if (local_60 != 0) {
      pAVar11 = (AV1_COMP_DATA *)(ppi->parallel_cpi + (long)local_60 * 9 + -5);
    }
    pAVar12->data2 = pAVar11;
    local_60 = local_60 + 1;
    src->setjmp = 0;
  }
  (ppi->p_mt_info).p_num_workers = (int)hook;
  return;
}

Assistant:

static inline void prepare_fpmt_workers(AV1_PRIMARY *ppi,
                                        AV1_COMP_DATA *first_cpi_data,
                                        AVxWorkerHook hook,
                                        int parallel_frame_count) {
  assert(parallel_frame_count <= ppi->num_fp_contexts &&
         parallel_frame_count > 1);

  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;
  int num_workers = p_mt_info->num_workers;

  volatile int frame_idx = 0;
  volatile int i = 0;
  while (i < num_workers) {
    // Assign level 1 worker
    AVxWorker *frame_worker = p_mt_info->p_workers[frame_idx] =
        &p_mt_info->workers[i];
    AV1_COMP *cur_cpi = ppi->parallel_cpi[frame_idx];
    MultiThreadInfo *mt_info = &cur_cpi->mt_info;
    // This 'aom_internal_error_info' pointer is not derived from the local
    // pointer ('AV1_COMMON *const cm') to silence the compiler warning
    // "variable 'cm' might be clobbered by 'longjmp' or 'vfork' [-Wclobbered]".
    struct aom_internal_error_info *const error = cur_cpi->common.error;

    // The jmp_buf is valid only within the scope of the function that calls
    // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
    // before it returns.
    if (setjmp(error->jmp)) {
      error->setjmp = 0;
      restore_workers_after_fpmt(ppi, parallel_frame_count, i);
      aom_internal_error_copy(&ppi->error, error);
    }
    error->setjmp = 1;

    AV1_COMMON *const cm = &cur_cpi->common;
    // Assign start of level 2 worker pool
    mt_info->workers = &p_mt_info->workers[i];
    mt_info->tile_thr_data = &p_mt_info->tile_thr_data[i];
    // Assign number of workers for each frame in the parallel encode set.
    mt_info->num_workers = compute_num_workers_per_frame(
        num_workers - i, parallel_frame_count - frame_idx);
    for (int j = MOD_FP; j < NUM_MT_MODULES; j++) {
      mt_info->num_mod_workers[j] =
          AOMMIN(mt_info->num_workers, p_mt_info->num_mod_workers[j]);
    }
    if (p_mt_info->cdef_worker != NULL) {
      mt_info->cdef_worker = &p_mt_info->cdef_worker[i];

      // Back up the original cdef_worker pointers.
      mt_info->restore_state_buf.cdef_srcbuf = mt_info->cdef_worker->srcbuf;
      const int num_planes = av1_num_planes(cm);
      for (int plane = 0; plane < num_planes; plane++)
        mt_info->restore_state_buf.cdef_colbuf[plane] =
            mt_info->cdef_worker->colbuf[plane];
    }
#if !CONFIG_REALTIME_ONLY
    if (is_restoration_used(cm)) {
      // Back up the original LR buffers before update.
      int idx = i + mt_info->num_workers - 1;
      assert(idx < mt_info->lr_row_sync.num_workers);
      mt_info->restore_state_buf.rst_tmpbuf =
          mt_info->lr_row_sync.lrworkerdata[idx].rst_tmpbuf;
      mt_info->restore_state_buf.rlbs =
          mt_info->lr_row_sync.lrworkerdata[idx].rlbs;

      // Update LR buffers.
      mt_info->lr_row_sync.lrworkerdata[idx].rst_tmpbuf = cm->rst_tmpbuf;
      mt_info->lr_row_sync.lrworkerdata[idx].rlbs = cm->rlbs;
    }
#endif

    i += mt_info->num_workers;

    // At this stage, the thread specific CDEF buffers for the current frame's
    // 'common' and 'cdef_sync' only need to be allocated. 'cdef_worker' has
    // already been allocated across parallel frames.
    av1_alloc_cdef_buffers(cm, &p_mt_info->cdef_worker, &mt_info->cdef_sync,
                           p_mt_info->num_workers, 0);

    frame_worker->hook = hook;
    frame_worker->data1 = cur_cpi;
    frame_worker->data2 = (frame_idx == 0)
                              ? first_cpi_data
                              : &ppi->parallel_frames_data[frame_idx - 1];
    frame_idx++;
    error->setjmp = 0;
  }
  p_mt_info->p_num_workers = parallel_frame_count;
}